

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::ReadAuxiliary
          (ByteCodeBufferReader *this,byte *buffer,FunctionBody *functionBody)

{
  code *pcVar1;
  FunctionBody *this_00;
  bool bVar2;
  byte *pbVar3;
  undefined4 *puVar4;
  ByteBlock *deserializeInto;
  uint uVar5;
  int local_54;
  FunctionBody *pFStack_50;
  uint32 sizeOfAuxiliaryBlock;
  int local_44;
  ByteBlock *pBStack_40;
  uint32 sizeOfAuxiliaryContextBlock;
  uint local_34 [2];
  uint32 countOfAuxiliaryStructure;
  
  pFStack_50 = functionBody;
  pbVar3 = ReadInt32(buffer,(size_t)(this->raw + ((long)this->totalSize - (long)buffer)),
                     (int *)local_34);
  if (local_34[0] == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0xb8b,"(countOfAuxiliaryStructure != 0)",
                                "countOfAuxiliaryStructure != 0");
    if (!bVar2) {
LAB_00893cf5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pbVar3 = ReadInt32(pbVar3,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar3)),&local_54);
  pbVar3 = ReadInt32(pbVar3,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar3)),&local_44);
  if (local_54 == 0) {
    deserializeInto = (ByteBlock *)0x0;
  }
  else {
    deserializeInto = ByteBlock::New(this->scriptContext->recycler,(byte *)0x0,local_54);
  }
  if (local_44 == 0) {
    pBStack_40 = (ByteBlock *)0x0;
  }
  else {
    pBStack_40 = ByteBlock::New(this->scriptContext->recycler,(byte *)0x0,local_44);
  }
  if (local_34[0] != 0) {
    uVar5 = 0;
    do {
      switch(pbVar3[4]) {
      case '\x01':
        pbVar3 = DeserializeVarArray<Js::AuxArray<void*>>
                           (this,this->scriptContext,pbVar3,deserializeInto);
        break;
      case '\x02':
        pbVar3 = DeserializeVarArray<Js::VarArrayVarCount>
                           (this,this->scriptContext,pbVar3,pBStack_40);
        break;
      case '\x03':
        pbVar3 = DeserializePropertyIdArray
                           (this,this->scriptContext,pbVar3,deserializeInto,pFStack_50);
        break;
      case '\x04':
        pbVar3 = DeserializeFuncInfoArray(this,this->scriptContext,pbVar3,deserializeInto);
        break;
      case '\x05':
        pbVar3 = DeserializeIntArray(this,this->scriptContext,pbVar3,deserializeInto);
        break;
      case '\x06':
        pbVar3 = DeserializeFloatArray(this,this->scriptContext,pbVar3,deserializeInto);
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0xba1,"(false)","Unexpected auxiliary kind");
        if (bVar2) {
          *puVar4 = 0;
          Throw::FatalInternalError(-0x7fffbffb);
        }
        goto LAB_00893cf5;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_34[0]);
  }
  this_00 = pFStack_50;
  FunctionProxy::SetAuxPtr((FunctionProxy *)pFStack_50,AuxBlock,deserializeInto);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this_00,AuxContextBlock,pBStack_40);
  return pbVar3;
}

Assistant:

const byte * ReadAuxiliary(const byte * buffer, FunctionBody * functionBody)
    {
        const byte * current = buffer;
        uint32 countOfAuxiliaryStructure;
        current = ReadUInt32(current, &countOfAuxiliaryStructure);
        Assert(countOfAuxiliaryStructure != 0);

        uint32 sizeOfAuxiliaryBlock;
        uint32 sizeOfAuxiliaryContextBlock;
        current = ReadUInt32(current, &sizeOfAuxiliaryBlock);
        current = ReadUInt32(current, &sizeOfAuxiliaryContextBlock);

        ByteBlock * auxBlock = sizeOfAuxiliaryBlock?
            ByteBlock::New(scriptContext->GetRecycler(), nullptr, sizeOfAuxiliaryBlock) : nullptr;
        ByteBlock * auxContextBlock = sizeOfAuxiliaryContextBlock?
            ByteBlock::New(scriptContext->GetRecycler(), nullptr, sizeOfAuxiliaryContextBlock) : nullptr;

        for (uint i = 0; i < countOfAuxiliaryStructure; i++)
        {
            typedef serialization_alignment const SerializedAuxiliary TBase;
            auto part = (serialization_alignment const SerializedAuxiliary * )current;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
            Assert(part->auxMagic == magicStartOfAux);
#endif
            switch(part->kind)
            {
            default:
                AssertMsg(false, "Unexpected auxiliary kind");
                Throw::FatalInternalError();
                break;

            case sakVarArrayIntCount:
                current = DeserializeVarArray<VarArray>(scriptContext, current, auxBlock);
                break;

            case sakVarArrayVarCount:
                current = DeserializeVarArray<VarArrayVarCount>(scriptContext, current, auxContextBlock);
                break;

            case sakIntArray:
                current = DeserializeIntArray(scriptContext, current, auxBlock);
                break;

            case sakFloatArray:
                current = DeserializeFloatArray(scriptContext, current, auxBlock);
                break;

            case sakPropertyIdArray:
                current = DeserializePropertyIdArray(scriptContext, current, auxBlock, functionBody);
                break;

            case sakFuncInfoArray:
                current = DeserializeFuncInfoArray(scriptContext, current, auxBlock);
                break;
            }
#ifdef BYTE_CODE_MAGIC_CONSTANTS
            int magicEnd;
            current = ReadInt32(current, &magicEnd);
            Assert(magicEnd == magicEndOfAux);
#endif
        }
        functionBody->SetAuxiliaryData(auxBlock);
        functionBody->SetAuxiliaryContextData(auxContextBlock);

        return current;
    }